

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t time_excluded(archive_match *a,archive_entry *entry)

{
  byte bVar1;
  uint uVar2;
  wchar_t wVar3;
  long lVar4;
  time_t tVar5;
  char *key;
  archive_rb_node *paVar6;
  
  if (a->newer_ctime_filter != L'\0') {
    wVar3 = archive_entry_ctime_is_set(entry);
    if (wVar3 == L'\0') {
      lVar4 = archive_entry_mtime(entry);
    }
    else {
      lVar4 = archive_entry_ctime(entry);
    }
    if (lVar4 < a->newer_ctime_sec) {
      return L'\x01';
    }
    if (lVar4 == a->newer_ctime_sec) {
      wVar3 = archive_entry_ctime_is_set(entry);
      if (wVar3 == L'\0') {
        lVar4 = archive_entry_mtime_nsec(entry);
      }
      else {
        lVar4 = archive_entry_ctime_nsec(entry);
      }
      if (lVar4 < a->newer_ctime_nsec) {
        return L'\x01';
      }
      if ((lVar4 == a->newer_ctime_nsec) && ((a->newer_ctime_filter & L'\x10') == L'\0')) {
        return L'\x01';
      }
    }
  }
  if (a->older_ctime_filter != L'\0') {
    wVar3 = archive_entry_ctime_is_set(entry);
    if (wVar3 == L'\0') {
      lVar4 = archive_entry_mtime(entry);
    }
    else {
      lVar4 = archive_entry_ctime(entry);
    }
    if (a->older_ctime_sec < lVar4) {
      return L'\x01';
    }
    if (lVar4 == a->older_ctime_sec) {
      wVar3 = archive_entry_ctime_is_set(entry);
      if (wVar3 == L'\0') {
        lVar4 = archive_entry_mtime_nsec(entry);
      }
      else {
        lVar4 = archive_entry_ctime_nsec(entry);
      }
      if (a->older_ctime_nsec < lVar4) {
        return L'\x01';
      }
      if ((lVar4 == a->older_ctime_nsec) && ((a->older_ctime_filter & L'\x10') == L'\0')) {
        return L'\x01';
      }
    }
  }
  if (a->newer_mtime_filter != L'\0') {
    tVar5 = archive_entry_mtime(entry);
    if (tVar5 < a->newer_mtime_sec) {
      return L'\x01';
    }
    if (tVar5 == a->newer_mtime_sec) {
      lVar4 = archive_entry_mtime_nsec(entry);
      if (lVar4 < a->newer_mtime_nsec) {
        return L'\x01';
      }
      if ((lVar4 == a->newer_mtime_nsec) && ((a->newer_mtime_filter & L'\x10') == L'\0')) {
        return L'\x01';
      }
    }
  }
  if (a->older_mtime_filter != L'\0') {
    tVar5 = archive_entry_mtime(entry);
    if (a->older_mtime_sec < tVar5) {
      return L'\x01';
    }
    lVar4 = archive_entry_mtime_nsec(entry);
    if (tVar5 == a->older_mtime_sec) {
      if (a->older_mtime_nsec < lVar4) {
        return L'\x01';
      }
      if ((lVar4 == a->older_mtime_nsec) && ((a->older_mtime_filter & L'\x10') == L'\0')) {
        return L'\x01';
      }
    }
  }
  if ((a->exclusion_entry_list).count == L'\0') {
    return L'\0';
  }
  key = archive_entry_pathname(entry);
  (a->exclusion_tree).rbt_ops = &rb_ops_mbs;
  if (key == (char *)0x0) {
    return L'\0';
  }
  paVar6 = __archive_rb_tree_find_node(&a->exclusion_tree,key);
  if (paVar6 == (archive_rb_node *)0x0) {
    return L'\0';
  }
  if ((paVar6[5].rb_info & 0x200) != 0) {
    tVar5 = archive_entry_ctime(entry);
    if (tVar5 < (long)paVar6[6].rb_info) {
LAB_003b11a8:
      bVar1 = (byte)paVar6[5].rb_info & 2;
    }
    else {
      if (tVar5 <= (long)paVar6[6].rb_info) {
        lVar4 = archive_entry_ctime_nsec(entry);
        if ((long)paVar6[7].rb_nodes[0] <= lVar4) {
          uVar2 = (uint)paVar6[5].rb_info;
          if ((long)paVar6[7].rb_nodes[0] < lVar4) {
            uVar2 = uVar2 & 1;
          }
          else {
            uVar2 = uVar2 & 0x10;
          }
          if (uVar2 != 0) {
            return L'\x01';
          }
          goto LAB_003b11ca;
        }
        goto LAB_003b11a8;
      }
      bVar1 = (byte)paVar6[5].rb_info & 1;
    }
    if (bVar1 != 0) {
      return L'\x01';
    }
  }
LAB_003b11ca:
  if ((paVar6[5].rb_info & 0x100) == 0) {
    return L'\0';
  }
  tVar5 = archive_entry_mtime(entry);
  if ((long)paVar6[6].rb_nodes[0] <= tVar5) {
    if ((long)paVar6[6].rb_nodes[0] < tVar5) {
      bVar1 = (byte)paVar6[5].rb_info & 1;
      goto joined_r0x003b1205;
    }
    lVar4 = archive_entry_mtime_nsec(entry);
    if ((long)paVar6[6].rb_nodes[1] <= lVar4) {
      uVar2 = (uint)paVar6[5].rb_info;
      if ((long)paVar6[6].rb_nodes[1] < lVar4) {
        uVar2 = uVar2 & 1;
      }
      else {
        uVar2 = uVar2 & 0x10;
      }
      if (uVar2 == 0) {
        return L'\0';
      }
      return L'\x01';
    }
  }
  bVar1 = (byte)paVar6[5].rb_info & 2;
joined_r0x003b1205:
  if (bVar1 == 0) {
    return L'\0';
  }
  return L'\x01';
}

Assistant:

static int
time_excluded(struct archive_match *a, struct archive_entry *entry)
{
	struct match_file *f;
	const void *pathname;
	time_t sec;
	long nsec;

	/*
	 * If this file/dir is excluded by a time comparison, skip it.
	 */
	if (a->newer_ctime_filter) {
		/* If ctime is not set, use mtime instead. */
		if (archive_entry_ctime_is_set(entry))
			sec = archive_entry_ctime(entry);
		else
			sec = archive_entry_mtime(entry);
		if (sec < a->newer_ctime_sec)
			return (1); /* Too old, skip it. */
		if (sec == a->newer_ctime_sec) {
			if (archive_entry_ctime_is_set(entry))
				nsec = archive_entry_ctime_nsec(entry);
			else
				nsec = archive_entry_mtime_nsec(entry);
			if (nsec < a->newer_ctime_nsec)
				return (1); /* Too old, skip it. */
			if (nsec == a->newer_ctime_nsec &&
			    (a->newer_ctime_filter & ARCHIVE_MATCH_EQUAL)
			      == 0)
				return (1); /* Equal, skip it. */
		}
	}
	if (a->older_ctime_filter) {
		/* If ctime is not set, use mtime instead. */
		if (archive_entry_ctime_is_set(entry))
			sec = archive_entry_ctime(entry);
		else
			sec = archive_entry_mtime(entry);
		if (sec > a->older_ctime_sec)
			return (1); /* Too new, skip it. */
		if (sec == a->older_ctime_sec) {
			if (archive_entry_ctime_is_set(entry))
				nsec = archive_entry_ctime_nsec(entry);
			else
				nsec = archive_entry_mtime_nsec(entry);
			if (nsec > a->older_ctime_nsec)
				return (1); /* Too new, skip it. */
			if (nsec == a->older_ctime_nsec &&
			    (a->older_ctime_filter & ARCHIVE_MATCH_EQUAL)
			      == 0)
				return (1); /* Equal, skip it. */
		}
	}
	if (a->newer_mtime_filter) {
		sec = archive_entry_mtime(entry);
		if (sec < a->newer_mtime_sec)
			return (1); /* Too old, skip it. */
		if (sec == a->newer_mtime_sec) {
			nsec = archive_entry_mtime_nsec(entry);
			if (nsec < a->newer_mtime_nsec)
				return (1); /* Too old, skip it. */
			if (nsec == a->newer_mtime_nsec &&
			    (a->newer_mtime_filter & ARCHIVE_MATCH_EQUAL)
			       == 0)
				return (1); /* Equal, skip it. */
		}
	}
	if (a->older_mtime_filter) {
		sec = archive_entry_mtime(entry);
		if (sec > a->older_mtime_sec)
			return (1); /* Too new, skip it. */
		nsec = archive_entry_mtime_nsec(entry);
		if (sec == a->older_mtime_sec) {
			if (nsec > a->older_mtime_nsec)
				return (1); /* Too new, skip it. */
			if (nsec == a->older_mtime_nsec &&
			    (a->older_mtime_filter & ARCHIVE_MATCH_EQUAL)
			       == 0)
				return (1); /* Equal, skip it. */
		}
	}

	/* If there is no exclusion list, include the file. */
	if (a->exclusion_entry_list.count == 0)
		return (0);

#if defined(_WIN32) && !defined(__CYGWIN__)
	pathname = archive_entry_pathname_w(entry);
	a->exclusion_tree.rbt_ops = &rb_ops_wcs;
#else
	(void)rb_ops_wcs;
	pathname = archive_entry_pathname(entry);
	a->exclusion_tree.rbt_ops = &rb_ops_mbs;
#endif
	if (pathname == NULL)
		return (0);

	f = (struct match_file *)__archive_rb_tree_find_node(
		&(a->exclusion_tree), pathname);
	/* If the file wasn't rejected, include it. */
	if (f == NULL)
		return (0);

	if (f->flag & ARCHIVE_MATCH_CTIME) {
		sec = archive_entry_ctime(entry);
		if (f->ctime_sec > sec) {
			if (f->flag & ARCHIVE_MATCH_OLDER)
				return (1);
		} else if (f->ctime_sec < sec) {
			if (f->flag & ARCHIVE_MATCH_NEWER)
				return (1);
		} else {
			nsec = archive_entry_ctime_nsec(entry);
			if (f->ctime_nsec > nsec) {
				if (f->flag & ARCHIVE_MATCH_OLDER)
					return (1);
			} else if (f->ctime_nsec < nsec) {
				if (f->flag & ARCHIVE_MATCH_NEWER)
					return (1);
			} else if (f->flag & ARCHIVE_MATCH_EQUAL)
				return (1);
		}
	}
	if (f->flag & ARCHIVE_MATCH_MTIME) {
		sec = archive_entry_mtime(entry);
		if (f->mtime_sec > sec) {
			if (f->flag & ARCHIVE_MATCH_OLDER)
				return (1);
		} else if (f->mtime_sec < sec) {
			if (f->flag & ARCHIVE_MATCH_NEWER)
				return (1);
		} else {
			nsec = archive_entry_mtime_nsec(entry);
			if (f->mtime_nsec > nsec) {
				if (f->flag & ARCHIVE_MATCH_OLDER)
					return (1);
			} else if (f->mtime_nsec < nsec) {
				if (f->flag & ARCHIVE_MATCH_NEWER)
					return (1);
			} else if (f->flag & ARCHIVE_MATCH_EQUAL)
				return (1);
		}
	}
	return (0);
}